

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

int __thiscall ON_wString::ReplaceWhiteSpace(ON_wString *this,wchar_t token,wchar_t *whitespace)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  bool bVar5;
  int iVar6;
  wchar_t *pwVar7;
  int local_3c;
  wchar_t c;
  int n;
  wchar_t *s1;
  wchar_t *s0;
  wchar_t *whitespace_local;
  wchar_t token_local;
  ON_wString *this_local;
  
  pwVar2 = this->m_s;
  if (pwVar2 == (wchar_t *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    iVar6 = Length(this);
    s1 = pwVar2;
    if ((whitespace == (wchar_t *)0x0) || (*whitespace == L'\0')) {
      do {
        if (pwVar2 + iVar6 <= s1) {
          return 0;
        }
        pwVar7 = s1 + 1;
        wVar1 = *s1;
      } while (((wVar1 < L'\x01') || (L' ' < wVar1)) && (s1 = pwVar7, wVar1 != L'\x7f'));
      pwVar2 = this->m_s;
      CopyArray(this);
      pwVar3 = this->m_s;
      pwVar4 = this->m_s;
      iVar6 = Length(this);
      (pwVar3 + (int)((long)pwVar7 - (long)pwVar2 >> 2))[-1] = token;
      local_3c = 1;
      pwVar2 = pwVar3 + (int)((long)pwVar7 - (long)pwVar2 >> 2);
      while (s1 = pwVar2, s1 < pwVar4 + iVar6) {
        wVar1 = *s1;
        pwVar2 = s1 + 1;
        if (((L'\0' < wVar1) && (wVar1 < L'!')) || (wVar1 == L'\x7f')) {
          *s1 = token;
          local_3c = local_3c + 1;
        }
      }
      this_local._4_4_ = local_3c;
    }
    else {
      do {
        if (pwVar2 + iVar6 <= s1) {
          return 0;
        }
        pwVar7 = s1 + 1;
        bVar5 = IsWhiteSpaceHelper(*s1,whitespace);
        s1 = pwVar7;
      } while (!bVar5);
      pwVar2 = this->m_s;
      CopyArray(this);
      pwVar3 = this->m_s;
      pwVar4 = this->m_s;
      iVar6 = Length(this);
      (pwVar3 + (int)((long)pwVar7 - (long)pwVar2 >> 2))[-1] = token;
      local_3c = 1;
      pwVar2 = pwVar3 + (int)((long)pwVar7 - (long)pwVar2 >> 2);
      while (s1 = pwVar2, s1 < pwVar4 + iVar6) {
        bVar5 = IsWhiteSpaceHelper(*s1,whitespace);
        pwVar2 = s1 + 1;
        if (bVar5) {
          *s1 = token;
          local_3c = local_3c + 1;
        }
      }
      this_local._4_4_ = local_3c;
    }
  }
  return this_local._4_4_;
}

Assistant:

int ON_wString::ReplaceWhiteSpace( wchar_t token, const wchar_t* whitespace )
{
  wchar_t* s0;
  wchar_t* s1;
  int n;
  wchar_t c;

  if ( 0 == (s0 = m_s) )
    return 0;
  s1 = s0 + Length();
  if ( whitespace && *whitespace )
  {
    while( s0 < s1 )
    {
      if (IsWhiteSpaceHelper(*s0++,whitespace))
      {
        // need to modify this string
        n = ((int)(s0 - m_s)); // keep win64 happy with (int) cast
        CopyArray(); // may change m_s if string has multiple refs
        s0 = m_s + n;
        s1 = m_s + Length();
        s0[-1] = token;
        n = 1;
        while ( s0 < s1 )
        {
          if ( IsWhiteSpaceHelper(*s0++,whitespace) )
          {
            s0[-1] = token;
            n++;
          }
        }
        return n;
      }
    }
  }
  else
  {
    while( s0 < s1 )
    {
      c = *s0++;
      if ( (1 <= c && c <= 32) || 127 == c )
      {
        // need to modify this string
        n = ((int)(s0 - m_s)); // keep win64 happy with (int) cast
        CopyArray(); // may change m_s if string has multiple refs
        s0 = m_s + n;
        s1 = m_s + Length();
        s0[-1] = token;
        n = 1;
        while ( s0 < s1 )
        {
          c = *s0++;
          if ( (1 <= c && c <= 32) || 127 == c )
          {
            s0[-1] = token;
            n++;
          }
        }
        return n;
      }
    }
  }
  return 0;
}